

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend)

{
  Expr *pExpr;
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (pAppend != (ExprList *)0x0) {
    if (pList == (ExprList *)0x0) {
      lVar2 = 0;
    }
    else {
      lVar2 = (long)pList->nExpr;
    }
    lVar3 = 0x20;
    for (lVar1 = 0; lVar1 < pAppend->nExpr; lVar1 = lVar1 + 1) {
      pExpr = sqlite3ExprDup(pParse->db,*(Expr **)((long)(pAppend->a + -1) + lVar3),0);
      pList = sqlite3ExprListAppend(pParse,pList,pExpr);
      if (pList != (ExprList *)0x0) {
        *(undefined1 *)((long)pList->a + lVar3 + lVar2 * 0x20 + -8) =
             *(undefined1 *)((long)pAppend->a + lVar3 + -8);
      }
      lVar3 = lVar3 + 0x20;
    }
  }
  return pList;
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend       /* List of values to append. Might be NULL */
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      Expr *pDup = sqlite3ExprDup(pParse->db, pAppend->a[i].pExpr, 0);
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].sortOrder = pAppend->a[i].sortOrder;
    }
  }
  return pList;
}